

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O0

void __thiscall Qentem::QTest::afterTest(QTest *this,bool test_for_leaks)

{
  char *local_40;
  char *local_38;
  SizeT local_30;
  char local_29;
  SizeT remaining_allocations;
  char *local_20;
  byte local_11;
  QTest *pQStack_10;
  bool test_for_leaks_local;
  QTest *this_local;
  
  local_11 = test_for_leaks;
  pQStack_10 = this;
  if ((this->error_ & 1U) == 0) {
    local_20 = TestOutPut::GetColor(PASS);
    _remaining_allocations = TestOutPut::GetColor(END);
    local_29 = '\n';
    TestOutPut::Print<char_const*,char[5],char_const*,char[3],char_const*,char>
              (&local_20,(char (*) [5])"Pass",(char **)&remaining_allocations,(char (*) [3])0x12f632
               ,&this->part_name_,&local_29);
  }
  if ((local_11 & 1) != 0) {
    local_30 = MemoryRecord::CheckSubMemory();
    MemoryRecord::ResetSubMemory();
    if (local_30 != 0) {
      local_38 = TestOutPut::GetColor(ERROR);
      local_40 = TestOutPut::GetColor(END);
      TestOutPut::Print<char_const*,char[14],char_const*,char[3],unsigned_int,char[25]>
                (&local_38,(char (*) [14])"Leak detected",&local_40,(char (*) [3])0x12f632,&local_30
                 ,(char (*) [25])" remaining allocations.\n");
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void afterTest(bool test_for_leaks) {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::PASS), "Pass",
                              TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        }

        if (test_for_leaks) {
            const SizeT remaining_allocations = MemoryRecord::CheckSubMemory();
            MemoryRecord::ResetSubMemory();

            if (remaining_allocations != 0) {
                TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Leak detected",
                                  TestOutPut::GetColor(TestOutPut::Colors::END), ": ", remaining_allocations,
                                  " remaining allocations.\n");
            }
        }
    }